

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtmpfil.cpp
# Opt level: O2

vm_tmpfil_ext * vm_tmpfil_ext::alloc_ext(CVmObjTemporaryFile *self,char *fname)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  vm_tmpfil_ext *pvVar3;
  
  sVar2 = strlen(fname);
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,sVar2 + 1,self);
  pvVar3 = (vm_tmpfil_ext *)strcpy((char *)CONCAT44(extraout_var,iVar1),fname);
  return pvVar3;
}

Assistant:

vm_tmpfil_ext *vm_tmpfil_ext::alloc_ext(VMG_ CVmObjTemporaryFile *self,
                                        const char *fname)
{
    /* calculate how much space we need */
    size_t siz = sizeof(vm_tmpfil_ext) + strlen(fname);

    /* allocate the memory */
    vm_tmpfil_ext *ext = (vm_tmpfil_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* copy the filename */
    strcpy(ext->filename, fname);

    /* return the new extension */
    return ext;
}